

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImageLoader::load_runtime_symtab_from_gsym(CVmImageLoader *this,ulong siz)

{
  undefined2 uVar1;
  CVmRuntimeSymbols *pCVar2;
  ulong len;
  ulong uVar3;
  size_t read_len;
  bool bVar4;
  undefined1 auVar5 [16];
  vm_val_t local_120;
  ulong siz_local;
  char buf [208];
  
  siz_local = siz;
  if (this->runtime_symtab_ == (CVmRuntimeSymbols *)0x0) {
    pCVar2 = (CVmRuntimeSymbols *)operator_new(0x18);
    pCVar2->head_ = (vm_runtime_sym *)0x0;
    pCVar2->tail_ = (vm_runtime_sym *)0x0;
    pCVar2->cnt_ = 0;
    this->runtime_symtab_ = pCVar2;
  }
  read_data(this,buf,4,&siz_local);
  uVar3 = (ulong)(uint)buf._0_4_;
switchD_0028be4d_caseD_4:
  while( true ) {
    bVar4 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar4) {
      return;
    }
    read_data(this,buf,6,&siz_local);
    uVar1 = buf._4_2_;
    len = (ulong)(ushort)buf._0_2_;
    read_len = (ushort)buf._2_2_ + len;
    if (len < 0x51) break;
    skip_data(this,read_len,&siz_local);
  }
  if ((uint)read_len < 0xd1) {
    read_data(this,buf,read_len,&siz_local);
  }
  else {
    read_data(this,buf,0xd0,&siz_local);
    skip_data(this,read_len - 0xd0,&siz_local);
  }
  switch(uVar1) {
  case 1:
    local_120.val.obj = (vm_obj_id_t)*(anon_struct_4_2_5f0bc21f_for_bifptr *)(buf + len);
    local_120.typ = VM_FUNCPTR;
    break;
  case 2:
    local_120.val.obj = (vm_obj_id_t)*(anon_struct_4_2_5f0bc21f_for_bifptr *)(buf + len);
    goto LAB_0028be96;
  case 3:
    local_120.typ = VM_PROP;
    local_120.val.prop = *(unsigned_short *)(buf + len);
    break;
  default:
    goto switchD_0028be4d_caseD_4;
  case 6:
    local_120.typ = VM_BIFPTR;
    auVar5 = pshuflw(ZEXT416(*(uint *)(buf + len)),ZEXT416(*(uint *)(buf + len)),0xe1);
    local_120.val.obj = auVar5._0_4_;
    break;
  case 9:
    local_120.val.obj = (vm_obj_id_t)*(anon_struct_4_2_5f0bc21f_for_bifptr *)(buf + len + 2);
LAB_0028be96:
    local_120.typ = VM_OBJ;
    break;
  case 10:
    local_120.val.obj = (vm_obj_id_t)*(anon_struct_4_2_5f0bc21f_for_bifptr *)(buf + len);
    local_120.typ = VM_ENUM;
  }
  CVmRuntimeSymbols::add_sym(this->runtime_symtab_,buf,len,&local_120);
  goto switchD_0028be4d_caseD_4;
}

Assistant:

void CVmImageLoader::load_runtime_symtab_from_gsym(VMG_ ulong siz)
{
    const size_t TOK_SYM_MAX_LEN = 80;
    char buf[TOK_SYM_MAX_LEN + 128];
    ulong cnt;

    /* allocate the symbol table if we haven't already done so */
    if (runtime_symtab_ == 0)
        runtime_symtab_ = new CVmRuntimeSymbols();

    /* read the symbol count */
    read_data(buf, 4, &siz);
    cnt = t3rp4u(buf);

    /* read the symbols and populate the symbol table */
    for ( ; cnt != 0 ; --cnt)
    {
        char *sym_name;
        size_t sym_len;
        size_t dat_len;
        tc_symtype_t sym_type;
        char *dat;
        vm_val_t val;

        /* read the symbol's length, extra data length, and type code */
        read_data(buf, 6, &siz);
        sym_len = osrp2(buf);
        dat_len = osrp2(buf + 2);
        sym_type = (tc_symtype_t)osrp2(buf + 4);

        /* check the lengths to make sure they don't overflow our buffer */
        if (sym_len > TOK_SYM_MAX_LEN)
        {
            /* 
             *   this symbol name is too long - skip the symbol and its
             *   extra data entirely 
             */
            skip_data(sym_len + dat_len, &siz);

            /* go on to the next symbol */
            continue;
        }
        else if (dat_len + sym_len > sizeof(buf))
        {
            /* 
             *   The extra data block is too long for our fixed buffer.
             *   Truncate the extra data so that we don't overflow our
             *   buffer, but proceed anyway with the truncated extra data.
             *   Note that we won't lose any data we care about, since any
             *   extra data beyond our buffer size is additional future
             *   format data that we don't know how to handle anyway.  By
             *   design, we're allowed to skip extra data that we don't know
             *   how to read.  
             */
            read_data(buf, sizeof(buf), &siz);

            /* skip the remainder of the extra data */
            skip_data(sym_len + dat_len - sizeof(buf), &siz);
        }
        else
        {
            /* read the symbol's name and its type-specific data */
            read_data(buf, sym_len + dat_len, &siz);
        }

        /* the symbol name is at the start of the buffer */
        sym_name = buf;

        /* get the pointer to the extra data (it comes after the name) */
        dat = buf + sym_len;

        /* create the new symbol table entry, depending on its type */
        switch(sym_type)
        {
        case TC_SYM_FUNC:
            /* set up the function pointer value */
            val.set_fnptr(t3rp4u(dat));
            break;

        case TC_SYM_OBJ:
            /* set up the object value */
            val.set_obj(t3rp4u(dat));
            break;

        case TC_SYM_PROP:
            /* set up the property value */
            val.set_propid(osrp2(dat));

            /* check the 'dictionary property' flag */
            if (dat_len >= 3 && (dat[0] & 0x01) != 0)
            {
                // $$$ it's a dictionary property
            }
            break;

        case TC_SYM_ENUM:
            /* set up the enum value */
            val.set_enum(t3rp4u(dat));

            /* check the 'enum token' flag */
            if (dat_len >= 5 && (dat[0] & 0x01) != 0)
            {
                // $$$ it's an 'enum token'
            }
            break;

        case TC_SYM_METACLASS:
            /* set up the metaclass object value */
            val.set_obj(t3rp4u(dat + 2));
            break;

        case TC_SYM_BIF:
            /* built-in function */
            val.set_bifptr(osrp2(dat + 2), osrp2(dat));
            break;

        default:
            /* 
             *   ignore other types; mark the value as 'empty' so we know we
             *   don't have anything to add to the table 
             */
            val.set_empty();
            break;
        }

        /* if we found a valid type, add it to the table */
        if (val.typ != VM_EMPTY)
            runtime_symtab_->add_sym(sym_name, sym_len, &val);
    }
}